

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.h
# Opt level: O1

TCGTemp * tcg_global_mem_new_internal_mipsel
                    (TCGContext_conflict4 *s,TCGType_conflict type,TCGv_ptr base,intptr_t offset,
                    char *name)

{
  int iVar1;
  TCGTemp *pTVar2;
  ulong uVar3;
  
  iVar1 = s->nb_temps;
  s->nb_globals = s->nb_globals + 1;
  s->nb_temps = iVar1 + 1;
  pTVar2 = s->temps + iVar1;
  *(undefined8 *)pTVar2 = 0;
  s->temps[iVar1].val = 0;
  s->temps[iVar1].name = (char *)0x0;
  s->temps[iVar1].state = 0;
  s->temps[iVar1].mem_base = (TCGTemp *)0x0;
  s->temps[iVar1].mem_offset = 0;
  s->temps[iVar1].state_ptr = (void *)0x0;
  *(undefined8 *)pTVar2 = 0x2000000000;
  if ((*(ulong *)(base + (long)&s->pool_cur) >> 0x20 & 1) == 0) {
    uVar3 = 0x200000000;
    *(ulong *)(base + (long)&s->pool_cur) = *(ulong *)(base + (long)&s->pool_cur) | 0x400000000;
    s->nb_indirects = s->nb_indirects + 1;
  }
  else {
    uVar3 = 0;
  }
  *(ulong *)pTVar2 =
       (ulong)(type << 0x18) |
       *(ulong *)pTVar2 & 0xffffffed0000ffff | (ulong)((type & 0xff) << 0x10) | uVar3 | 0x1000000000
  ;
  s->temps[iVar1].mem_base = (TCGTemp *)(base + (long)&s->pool_cur);
  s->temps[iVar1].mem_offset = offset;
  s->temps[iVar1].name = name;
  return pTVar2;
}

Assistant:

static inline TCGTemp *tcgv_i32_temp(TCGContext *tcg_ctx, TCGv_i32 v)
{
    uintptr_t o = (uintptr_t)v;
    TCGTemp *t = (TCGTemp *)((char *)tcg_ctx + o);
    tcg_debug_assert(offsetof(TCGContext, temps[temp_idx(tcg_ctx, t)]) == o);
    return t;
}